

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

void __thiscall
dxil_spv::CFGNode::
traverse_dominated_blocks<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__2>
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header,
          anon_class_48_6_eac293d1 *op)

{
  pointer ppCVar1;
  CFGNode *stop_block;
  CFGNode *end_block;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  anon_class_48_6_eac293d1 *op_00;
  pointer ppCVar5;
  __hashtable *__h;
  CFGNode *node;
  CFGNode *local_58;
  anon_class_48_6_eac293d1 *local_50;
  CFGStructurizer *local_48;
  CFGNode *local_40;
  UnorderedSet<const_CFGNode_*> *local_38;
  
  ppCVar5 = (this->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = header;
  local_50 = op;
  do {
    if (ppCVar5 == ppCVar1) {
      return;
    }
    local_58 = *ppCVar5;
    sVar4 = std::
            _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&completed->_M_h,&local_58);
    if (sVar4 == 0) {
      local_38 = completed;
      std::
      _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<dxil_spv::CFGNode_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
                ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)completed,&local_58,&local_38);
      bVar2 = dominates(header,local_58);
      op_00 = local_50;
      end_block = local_58;
      if (((bVar2) && (*local_50->merge != local_58)) &&
         (local_58->pred_back_edge == (CFGNode *)0x0)) {
        local_48 = local_50->this;
        uVar3 = num_forward_preds(local_58);
        header = local_40;
        if (1 < uVar3) {
          stop_block = end_block->immediate_dominator;
          if (stop_block == *op_00->header) {
            *op_00->found_inner_merge_target = true;
            goto LAB_00144940;
          }
          if (((*op_00->potential_inner_merge_target == (CFGNode *)0x0) ||
              (end_block->forward_post_visit_order <
               (*op_00->potential_inner_merge_target)->forward_post_visit_order)) &&
             ((stop_block->immediate_post_dominator == *op_00->merge &&
              (bVar2 = CFGStructurizer::exists_path_in_cfg_without_intermediate_node
                                 (local_48,*op_00->header,end_block,stop_block), op_00 = local_50,
              !bVar2)))) {
            *local_50->potential_inner_merge_target = end_block;
          }
        }
        traverse_dominated_blocks<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__2>
                  (local_58,completed,header,op_00);
      }
    }
LAB_00144940:
    ppCVar5 = ppCVar5 + 1;
  } while( true );
}

Assistant:

void CFGNode::traverse_dominated_blocks(UnorderedSet<const CFGNode *> &completed,
                                        const CFGNode &header, const Op &op) const
{
	for (auto *node : succ)
	{
		bool can_visit = completed.count(node) == 0;
		if (can_visit)
			completed.insert(node);

		if (can_visit && header.dominates(node))
		{
			if (op(node))
				node->traverse_dominated_blocks(completed, header, op);
		}
	}
}